

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydbalance.cpp
# Opt level: O3

void findNodeOutflows(double lamda,double *dH,double *xQ,Network *nw)

{
  pointer ppNVar1;
  uint uVar2;
  int iVar3;
  pointer ppNVar4;
  Node *pNVar5;
  ulong uVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  double dVar8;
  double extraout_XMM0_Qa_00;
  double dVar9;
  double local_38;
  double dqdh;
  
  ppNVar1 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar4 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1) {
    pNVar5 = *ppNVar4;
    pNVar5->outflow = 0.0;
    pNVar5->qGrad = 0.0;
  }
  if (nw->leakageModel != (LeakageModel *)0x0) {
    findLeakageFlows(lamda,dH,xQ,nw);
  }
  uVar2 = Network::count(nw,NODE);
  if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      pNVar5 = Network::node(nw,(int)uVar6);
      dVar7 = dH[uVar6] * lamda + pNVar5->head;
      local_38 = 0.0;
      iVar3 = (*(pNVar5->super_Element)._vptr_Element[2])(pNVar5);
      if (iVar3 == 0) {
        (*(pNVar5->super_Element)._vptr_Element[7])(dVar7,pNVar5,&local_38);
        pNVar5->qGrad = local_38 + pNVar5->qGrad;
        pNVar5->outflow = pNVar5->outflow + extraout_XMM0_Qa;
        dVar8 = xQ[uVar6] - extraout_XMM0_Qa;
        xQ[uVar6] = dVar8;
        dVar9 = dVar8;
        if (pNVar5->fixedGrade != true) {
          (*(pNVar5->super_Element)._vptr_Element[6])(dVar7,pNVar5,nw,&local_38);
          pNVar5->qGrad = local_38 + pNVar5->qGrad;
          dVar8 = extraout_XMM0_Qa_00;
          dVar9 = xQ[uVar6];
        }
        xQ[uVar6] = dVar9 - dVar8;
        pNVar5->actualDemand = dVar8;
        pNVar5->outflow = dVar8 + pNVar5->outflow;
      }
      else {
        pNVar5->outflow = xQ[uVar6];
        xQ[uVar6] = 0.0;
      }
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  return;
}

Assistant:

void findNodeOutflows(double lamda, double dH[], double xQ[], Network* nw)
{
    // ... initialize node outflows and their gradients w.r.t. head

    for (Node* node : nw->nodes)
    {
        node->outflow = 0.0;
        node->qGrad = 0.0;
    }

    // ... find pipe leakage flows & assign them to node outflows

    if ( nw->leakageModel ) findLeakageFlows(lamda, dH, xQ, nw);

    // ... add emitter flows and demands to node outflows

    int nodeCount = nw->count(Element::NODE);
    for (int i = 0; i < nodeCount; i++)
    {
        Node* node = nw->node(i);
        double h = node->head + lamda * dH[i];
        double q = 0.0;
        double dqdh = 0.0;

        // ... for junctions, outflow depends on head

        if ( node->type() == Node::JUNCTION )
        {
            // ... contribution from emitter flow

            q = node->findEmitterFlow(h, dqdh);
            node->qGrad += dqdh;
            node->outflow += q;
            xQ[i] -= q;

            // ... contribution from demand flow

            // ... for fixed grade junction, demand is remaining flow excess
            if ( node->fixedGrade )
            {
                q = xQ[i];
                xQ[i] -= q;
            }

            // ... otherwise junction has pressure-dependent demand
            else
            {
                q = node->findActualDemand(nw, h, dqdh);
                node->qGrad += dqdh;
                xQ[i] -= q;
            }
            node->actualDemand = q;
            node->outflow += q;
        }

        // ... for tanks and reservoirs all flow excess becomes outflow

        else
        {
            node->outflow = xQ[i];
            xQ[i] = 0.0;
        }
    }
}